

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2builderutil_find_polygon_degeneracies.cc
# Opt level: O0

int __thiscall
s2builderutil::anon_unknown_0::DegeneracyFinder::ContainsVertexSign
          (DegeneracyFinder *this,VertexId v0)

{
  Graph *this_00;
  int iVar1;
  S2Point *pSVar2;
  EdgeId *pEVar3;
  Edge *pEVar4;
  VertexInEdgeIds VVar5;
  EdgeId e;
  EdgeId *__end2_1;
  EdgeId *__begin2_1;
  EdgeId *local_98;
  VertexInEdgeIds *local_90;
  VertexInEdgeIds *__range2_1;
  Edge *edge;
  Edge *__end2;
  Edge *__begin2;
  VertexOutEdges local_60;
  VertexOutEdges *local_50;
  VertexOutEdges *__range2;
  S2ContainsVertexQuery query;
  VertexId v0_local;
  DegeneracyFinder *this_local;
  
  query.edge_map_.
  super_btree_map_container<gtl::internal_btree::btree<gtl::internal_btree::map_params<Vector3<double>,_int,_std::less<Vector3<double>_>,_std::allocator<std::pair<const_Vector3<double>,_int>_>,_256,_false>_>_>
  .
  super_btree_set_container<gtl::internal_btree::btree<gtl::internal_btree::map_params<Vector3<double>,_int,_std::less<Vector3<double>_>,_std::allocator<std::pair<const_Vector3<double>,_int>_>,_256,_false>_>_>
  .
  super_btree_container<gtl::internal_btree::btree<gtl::internal_btree::map_params<Vector3<double>,_int,_std::less<Vector3<double>_>,_std::allocator<std::pair<const_Vector3<double>,_int>_>,_256,_false>_>_>
  .tree_.size_._4_4_ = v0;
  pSVar2 = S2Builder::Graph::vertex(this->g_,v0);
  S2ContainsVertexQuery::S2ContainsVertexQuery((S2ContainsVertexQuery *)&__range2,pSVar2);
  local_60 = S2Builder::Graph::VertexOutMap::edges
                       (&this->out_,
                        query.edge_map_.
                        super_btree_map_container<gtl::internal_btree::btree<gtl::internal_btree::map_params<Vector3<double>,_int,_std::less<Vector3<double>_>,_std::allocator<std::pair<const_Vector3<double>,_int>_>,_256,_false>_>_>
                        .
                        super_btree_set_container<gtl::internal_btree::btree<gtl::internal_btree::map_params<Vector3<double>,_int,_std::less<Vector3<double>_>,_std::allocator<std::pair<const_Vector3<double>,_int>_>,_256,_false>_>_>
                        .
                        super_btree_container<gtl::internal_btree::btree<gtl::internal_btree::map_params<Vector3<double>,_int,_std::less<Vector3<double>_>,_std::allocator<std::pair<const_Vector3<double>,_int>_>,_256,_false>_>_>
                        .tree_.size_._4_4_);
  local_50 = &local_60;
  __end2 = S2Builder::Graph::VertexOutEdges::begin(local_50);
  edge = S2Builder::Graph::VertexOutEdges::end(local_50);
  for (; __end2 != edge; __end2 = __end2 + 1) {
    __range2_1 = (VertexInEdgeIds *)__end2;
    pSVar2 = S2Builder::Graph::vertex(this->g_,__end2->second);
    S2ContainsVertexQuery::AddEdge((S2ContainsVertexQuery *)&__range2,pSVar2,1);
  }
  VVar5 = S2Builder::Graph::VertexInMap::edge_ids
                    (&this->in_,
                     query.edge_map_.
                     super_btree_map_container<gtl::internal_btree::btree<gtl::internal_btree::map_params<Vector3<double>,_int,_std::less<Vector3<double>_>,_std::allocator<std::pair<const_Vector3<double>,_int>_>,_256,_false>_>_>
                     .
                     super_btree_set_container<gtl::internal_btree::btree<gtl::internal_btree::map_params<Vector3<double>,_int,_std::less<Vector3<double>_>,_std::allocator<std::pair<const_Vector3<double>,_int>_>,_256,_false>_>_>
                     .
                     super_btree_container<gtl::internal_btree::btree<gtl::internal_btree::map_params<Vector3<double>,_int,_std::less<Vector3<double>_>,_std::allocator<std::pair<const_Vector3<double>,_int>_>,_256,_false>_>_>
                     .tree_.size_._4_4_);
  local_98 = VVar5.end_;
  __begin2_1 = VVar5.begin_;
  local_90 = (VertexInEdgeIds *)&__begin2_1;
  __end2_1 = S2Builder::Graph::VertexInEdgeIds::begin(local_90);
  pEVar3 = S2Builder::Graph::VertexInEdgeIds::end(local_90);
  for (; __end2_1 != pEVar3; __end2_1 = __end2_1 + 1) {
    this_00 = this->g_;
    pEVar4 = S2Builder::Graph::edge(this_00,*__end2_1);
    pSVar2 = S2Builder::Graph::vertex(this_00,pEVar4->first);
    S2ContainsVertexQuery::AddEdge((S2ContainsVertexQuery *)&__range2,pSVar2,-1);
  }
  iVar1 = S2ContainsVertexQuery::ContainsSign((S2ContainsVertexQuery *)&__range2);
  S2ContainsVertexQuery::~S2ContainsVertexQuery((S2ContainsVertexQuery *)&__range2);
  return iVar1;
}

Assistant:

int DegeneracyFinder::ContainsVertexSign(VertexId v0) const {
  S2ContainsVertexQuery query(g_.vertex(v0));
  for (const Edge& edge : out_.edges(v0)) {
    query.AddEdge(g_.vertex(edge.second), 1);
  }
  for (EdgeId e : in_.edge_ids(v0)) {
    query.AddEdge(g_.vertex(g_.edge(e).first), -1);
  }
  return query.ContainsSign();
}